

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

void Sfm_DecVarCost(Sfm_Dec_t *p,word (*Masks) [8],int d,int (*Counts) [2])

{
  bool bVar1;
  ulong uVar2;
  int Count;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  
  if (-1 < d) {
    lVar8 = 0;
    bVar7 = true;
    while (d << 3 < p->vSets[lVar8].nSize) {
      lVar9 = (long)p->nPatWords[lVar8];
      if (lVar9 < 1) {
        iVar5 = 0;
        uVar3 = 0;
      }
      else {
        lVar6 = 0;
        iVar5 = 0;
        do {
          uVar2 = Masks[lVar8][lVar6] - (Masks[lVar8][lVar6] >> 1 & 0x5555555555555555);
          uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
          uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f;
          uVar2 = (uVar2 >> 8) + uVar2;
          lVar4 = (uVar2 >> 0x10) + uVar2;
          iVar5 = iVar5 + ((int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xffU);
          lVar6 = lVar6 + 1;
        } while (lVar9 != lVar6);
        lVar6 = 0;
        uVar3 = 0;
        do {
          uVar2 = p->vSets[lVar8].pArray[(ulong)(uint)(d << 3) + lVar6] & Masks[lVar8][lVar6];
          uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
          uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
          uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f;
          uVar2 = (uVar2 >> 8) + uVar2;
          lVar4 = (uVar2 >> 0x10) + uVar2;
          uVar3 = uVar3 + ((int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xffU);
          lVar6 = lVar6 + 1;
        } while (lVar9 != lVar6);
      }
      Counts[lVar8][1] = uVar3;
      Counts[lVar8][0] = iVar5 - uVar3;
      if ((int)(iVar5 - uVar3 | uVar3) < 0) {
        __assert_fail("Counts[c][0] >= 0 && Counts[c][1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                      ,0x274,"void Sfm_DecVarCost(Sfm_Dec_t *, word (*)[8], int, int (*)[2])");
      }
      lVar8 = 1;
      bVar1 = !bVar7;
      bVar7 = false;
      if (bVar1) {
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

void Sfm_DecVarCost( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS], int d, int Counts[2][2] )
{
    int c; 
    for ( c = 0; c < 2; c++ )
    {
        word * pPats = Sfm_DecDivPats( p, d, c );
        int Num = Abc_TtCountOnesVec( Masks[c], p->nPatWords[c] );
        Counts[c][1] = Abc_TtCountOnesVecMask( pPats, Masks[c], p->nPatWords[c], 0 );
        Counts[c][0] = Num - Counts[c][1];
        assert( Counts[c][0] >= 0 && Counts[c][1] >= 0 );
    }
    //printf( "%5d %5d   %5d %5d \n", Counts[0][0], Counts[0][1], Counts[1][0], Counts[1][1] );
}